

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O0

void __thiscall QMetaMethodBuilder::setConst(QMetaMethodBuilder *this,bool methodIsConst)

{
  QMetaMethodBuilderPrivate *pQVar1;
  byte in_SIL;
  QMetaMethodBuilder *in_RDI;
  QMetaMethodBuilderPrivate *d;
  
  pQVar1 = d_func(in_RDI);
  if (pQVar1 != (QMetaMethodBuilderPrivate *)0x0) {
    if ((in_SIL & 1) == 0) {
      pQVar1->attributes = pQVar1->attributes & 0xfffffeff;
    }
    else {
      pQVar1->attributes = pQVar1->attributes | 0x100;
    }
  }
  return;
}

Assistant:

void QMetaMethodBuilder::setConst(bool methodIsConst)
{
    QMetaMethodBuilderPrivate *d = d_func();
    if (!d)
        return;
    if (methodIsConst)
        d->attributes |= MethodIsConst;
    else
        d->attributes &= ~MethodIsConst;
}